

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O0

int getMicroSecondTimeout(timeval *timeout)

{
  int iVar1;
  timeval tVar2;
  long local_38;
  long local_30;
  ssize_t local_28;
  ssize_t result;
  timeval now;
  timeval *timeout_local;
  
  tVar2 = tutil_tvnow();
  local_38 = tVar2.tv_sec;
  local_30 = tVar2.tv_usec;
  local_28 = ((timeout->tv_sec - local_38) * 1000000 + timeout->tv_usec) - local_30;
  if (local_28 < 0) {
    local_28 = 0;
  }
  iVar1 = curlx_sztosi(local_28);
  return iVar1;
}

Assistant:

static int getMicroSecondTimeout(struct timeval* timeout)
{
  struct timeval now;
  ssize_t result;
  now = tutil_tvnow();
  result = (timeout->tv_sec - now.tv_sec) * 1000000 +
    timeout->tv_usec - now.tv_usec;
  if(result < 0)
    result = 0;

  return curlx_sztosi(result);
}